

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void discordpp::from_json(json *j,field<discordpp::User> *f)

{
  state sVar1;
  User *this;
  pointer __p;
  __uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_> local_170;
  User local_168;
  
  if (j->m_type == null) {
    std::__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>::reset
              ((__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_> *)f,
               (pointer)0x0);
    sVar1 = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::User,_0>(&local_168,j);
    this = (User *)operator_new(0x150);
    User::User(this,&local_168);
    local_170._M_t.super__Tuple_impl<0UL,_discordpp::User_*,_std::default_delete<discordpp::User>_>.
    super__Head_base<0UL,_discordpp::User_*,_false>._M_head_impl =
         (tuple<discordpp::User_*,_std::default_delete<discordpp::User>_>)
         (_Tuple_impl<0UL,_discordpp::User_*,_std::default_delete<discordpp::User>_>)0x0;
    std::__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>::reset
              ((__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_> *)f,this);
    std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
              ((unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_> *)&local_170);
    User::~User(&local_168);
    sVar1 = present_e;
  }
  f->s_ = sVar1;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }